

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall asmjit::ZoneBitVector::fill(ZoneBitVector *this,size_t from,size_t to,bool value)

{
  long *plVar1;
  long *plVar2;
  ZoneHeap *this_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  undefined8 *puVar6;
  void *pvVar7;
  sbyte sVar8;
  sbyte sVar9;
  long *plVar10;
  uint uVar11;
  long extraout_RDX;
  long *plVar12;
  long extraout_RDX_00;
  Error EVar13;
  uint uVar14;
  ZoneBitVector *pZVar15;
  ulong uVar16;
  long lVar17;
  long lVar18;
  ulong uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  size_t sStack_60;
  ZoneBitVector *pZStack_58;
  size_t sStack_30;
  
  if (to <= from) {
    return (uint)(to < from) + (uint)(to < from) * 2;
  }
  if (*(ulong *)(this + 8) < from) {
    fill();
LAB_001198c9:
    fill();
LAB_001198ce:
    fill();
  }
  else {
    if (*(ulong *)(this + 8) < to) goto LAB_001198c9;
    this = *(ZoneBitVector **)this;
    if (this == (ZoneBitVector *)0x0) goto LAB_001198ce;
    uVar5 = from >> 6;
    uVar14 = (uint)from & 0x3f;
    from = (size_t)uVar14;
    uVar16 = to >> 6;
    uVar11 = (uint)to & 0x3f;
    sVar8 = (sbyte)uVar11;
    if ((ZoneHeap *)from == (ZoneHeap *)0x0) {
LAB_001197dc:
      auVar4 = _DAT_001329e0;
      auVar3 = _DAT_001329d0;
      lVar17 = uVar16 - uVar5;
      if (uVar5 <= uVar16 && lVar17 != 0) {
        lVar18 = lVar17 + -1;
        auVar20._8_4_ = (int)lVar18;
        auVar20._0_8_ = lVar18;
        auVar20._12_4_ = (int)((ulong)lVar18 >> 0x20);
        uVar19 = 0;
        auVar20 = auVar20 ^ _DAT_001329e0;
        do {
          auVar21._8_4_ = (int)uVar19;
          auVar21._0_8_ = uVar19;
          auVar21._12_4_ = (int)(uVar19 >> 0x20);
          auVar21 = (auVar21 | auVar3) ^ auVar4;
          if ((bool)(~(auVar21._4_4_ == auVar20._4_4_ && auVar20._0_4_ < auVar21._0_4_ ||
                      auVar20._4_4_ < auVar21._4_4_) & 1)) {
            *(ulong *)(this + uVar19 * 8 + uVar5 * 8) = -(ulong)value;
          }
          if ((auVar21._12_4_ != auVar20._12_4_ || auVar21._8_4_ <= auVar20._8_4_) &&
              auVar21._12_4_ <= auVar20._12_4_) {
            *(ulong *)(this + uVar19 * 8 + uVar5 * 8 + 8) = -(ulong)value;
          }
          uVar19 = uVar19 + 2;
        } while ((lVar17 + 1U & 0xfffffffffffffffe) != uVar19);
      }
      if ((to & 0x3f) != 0) {
        uVar5 = -1L << sVar8;
        if (value) {
          *(ulong *)(this + uVar16 * 8) = *(ulong *)(this + uVar16 * 8) | ~uVar5;
        }
        else {
          *(ulong *)(this + uVar16 * 8) = *(ulong *)(this + uVar16 * 8) & uVar5;
        }
      }
      return 0;
    }
    sVar9 = (sbyte)uVar14;
    if (uVar5 != uVar16) {
      if (value) {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) | -1L << sVar9;
      }
      else {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) & ~(-1L << sVar9);
      }
      uVar5 = uVar5 + 1;
      goto LAB_001197dc;
    }
    if (uVar14 < uVar11) {
      uVar16 = ~(-1L << (sVar8 - sVar9 & 0x3fU)) << sVar9;
      if (value) {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) | uVar16;
      }
      else {
        *(ulong *)(this + uVar5 * 8) = *(ulong *)(this + uVar5 * 8) & ~uVar16;
      }
      return 0;
    }
  }
  fill();
  plVar1 = *(long **)this;
  if (plVar1 != (long *)0x0) {
    if (*(long **)(this + 8) != (long *)0x0) {
      if (*plVar1 == 0) {
        pZVar15 = this;
        ZoneStackBase::_init();
        this_00 = *(ZoneHeap **)pZVar15;
        pZStack_58 = this;
        if (this_00 == (ZoneHeap *)0x0) {
          ZoneStackBase::_prepareBlock();
        }
        else {
          uVar5 = from & 0xffffffff;
          lVar17 = *(long *)(pZVar15 + uVar5 * 8 + 8);
          if (*(long *)(lVar17 + 0x10) != *(long *)(lVar17 + 0x18)) {
            if (this_00->_zone != (Zone *)0x0) {
              pvVar7 = ZoneHeap::_alloc(this_00,0x200,&sStack_60);
              if (pvVar7 == (void *)0x0) {
                return 1;
              }
              *(undefined8 *)((long)pvVar7 + uVar5 * 8) = 0;
              *(long *)((long)pvVar7 + (ulong)((int)from == 0) * 8) = lVar17;
              *(long *)((long)pvVar7 + 0x10) = extraout_RDX_00 + (long)pvVar7;
              *(long *)((long)pvVar7 + 0x18) = extraout_RDX_00 + (long)pvVar7;
              *(void **)(lVar17 + uVar5 * 8) = pvVar7;
              *(void **)(pZVar15 + uVar5 * 8 + 8) = pvVar7;
              return 0;
            }
            goto LAB_00119a0e;
          }
        }
        ZoneStackBase::_prepareBlock();
LAB_00119a0e:
        ZoneStackBase::_prepareBlock();
        return 1;
      }
      plVar2 = *(long **)(this + 8);
      plVar12 = (long *)plVar1[10];
      do {
        plVar10 = plVar2;
        plVar2 = (long *)plVar10[1];
        *plVar10 = (long)plVar12;
        plVar1[10] = (long)plVar10;
        plVar12 = plVar10;
      } while (plVar2 != (long *)0x0);
    }
    *(long *)this = 0;
    *(long *)(this + 8) = 0;
    *(long *)(this + 0x10) = 0;
  }
  EVar13 = 0;
  if ((ZoneHeap *)from != (ZoneHeap *)0x0) {
    if (((ZoneHeap *)from)->_zone == (Zone *)0x0) {
      ZoneStackBase::_init();
    }
    else {
      puVar6 = (undefined8 *)ZoneHeap::_alloc((ZoneHeap *)from,0x200,&sStack_30);
      if (puVar6 != (undefined8 *)0x0) {
        *puVar6 = 0;
        puVar6[1] = 0;
        puVar6[2] = extraout_RDX + (long)puVar6;
        puVar6[3] = extraout_RDX + (long)puVar6;
        *(size_t *)this = from;
        *(undefined8 **)(this + 8) = puVar6;
        *(undefined8 **)(this + 0x10) = puVar6;
        return 0;
      }
    }
    EVar13 = 1;
  }
  return EVar13;
}

Assistant:

Error ZoneBitVector::fill(size_t from, size_t to, bool value) noexcept {
  if (ASMJIT_UNLIKELY(from >= to)) {
    if (from > to)
      return DebugUtils::errored(kErrorInvalidArgument);
    else
      return kErrorOk;
  }

  ASMJIT_ASSERT(from <= _length);
  ASMJIT_ASSERT(to <= _length);

  // This is very similar to `ZoneBitVector::_fill()`, however, since we
  // actually set bits that are already part of the container we need to
  // special case filiing to zeros and ones.
  size_t idx = from / kBitsPerWord;
  size_t startBit = from % kBitsPerWord;

  size_t endIdx = to / kBitsPerWord;
  size_t endBit = to % kBitsPerWord;

  BitWord* data = _data;
  ASMJIT_ASSERT(data != nullptr);

  // Special case for non-zero `startBit`.
  if (startBit) {
    if (idx == endIdx) {
      ASMJIT_ASSERT(startBit < endBit);

      size_t nBits = endBit - startBit;
      BitWord mask = ((static_cast<BitWord>(1) << nBits) - 1) << startBit;

      if (value)
        data[idx] |= mask;
      else
        data[idx] &= ~mask;
      return kErrorOk;
    }
    else {
      BitWord mask = (static_cast<BitWord>(0) - 1) << startBit;

      if (value)
        data[idx++] |= mask;
      else
        data[idx++] &= ~mask;
    }
  }

  // Fill all bits in case there is a gap between the current `idx` and `endIdx`.
  if (idx < endIdx) {
    BitWord pattern = _patternFromBit(value);
    do {
      data[idx++] = pattern;
    } while (idx < endIdx);
  }

  // Special case for non-zero `endBit`.
  if (endBit) {
    BitWord mask = ((static_cast<BitWord>(1) << endBit) - 1);
    if (value)
      data[endIdx] |= mask;
    else
      data[endIdx] &= ~mask;
  }

  return kErrorOk;
}